

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O1

void __thiscall hnsw::HNSWIndex::LoadIndex(HNSWIndex *this,char *filename)

{
  uint32_t *puVar1;
  int iVar2;
  pointer pVVar3;
  bool bVar4;
  vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *pvVar5;
  ulong uVar6;
  uint uVar7;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *neighbors;
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *this_00;
  long lVar8;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  index_t idx;
  index_t num_neighbors;
  index_t edge;
  int layers [32];
  ifstream is;
  uint local_300;
  uint local_2fc;
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *local_2f8;
  HNSWIndex *local_2f0;
  long local_2e8;
  float local_2e0;
  uint local_2dc;
  ulong local_2d8;
  long local_2d0;
  vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *local_2c8;
  long local_2c0;
  uint local_2b8 [32];
  char local_238 [520];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  printf("Loading index from %s\n");
  std::ifstream::ifstream(local_238,filename,_S_in|_S_bin);
  puVar1 = &this->num_points_;
  std::istream::read(local_238,(long)puVar1);
  std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::resize
            (&this->vertices_,(ulong)this->num_points_);
  local_2b8[0x10] = 0;
  local_2b8[0x11] = 0;
  local_2b8[0x12] = 0;
  local_2b8[0x13] = 0;
  local_2b8[0x14] = 0;
  local_2b8[0x15] = 0;
  local_2b8[0x16] = 0;
  local_2b8[0x17] = 0;
  local_2b8[0x18] = 0;
  local_2b8[0x19] = 0;
  local_2b8[0x1a] = 0;
  local_2b8[0x1b] = 0;
  local_2b8[0x1c] = 0;
  local_2b8[0x1d] = 0;
  local_2b8[0x1e] = 0;
  local_2b8[0x1f] = 0;
  local_2b8[0] = 0;
  local_2b8[1] = 0;
  local_2b8[2] = 0;
  local_2b8[3] = 0;
  local_2b8[4] = 0;
  local_2b8[5] = 0;
  local_2b8[6] = 0;
  local_2b8[7] = 0;
  local_2b8[8] = 0;
  local_2b8[9] = 0;
  local_2b8[10] = 0;
  local_2b8[0xb] = 0;
  local_2b8[0xc] = 0;
  local_2b8[0xd] = 0;
  local_2b8[0xe] = 0;
  local_2b8[0xf] = 0;
  this->ep_ = 0;
  this->top_layer_ = 0;
  if (this->num_points_ == 0) {
    local_2f8 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                 *)0x0;
    lVar8 = 0;
  }
  else {
    local_2d8 = 0;
    local_2d0 = 0;
    local_2e8 = 0;
    local_2f0 = this;
    local_2c8 = &this->vertices_;
    do {
      pvVar5 = local_2c8;
      std::istream::read(local_238,(long)&local_300);
      std::istream::read(local_238,
                         (long)&(pvVar5->
                                super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                                )._M_impl.super__Vector_impl_data._M_start[local_300].layer);
      auVar10._8_56_ = extraout_var;
      auVar10._0_8_ = extraout_XMM1_Qa;
      auVar9 = auVar10._0_16_;
      pVVar3 = (pvVar5->
               super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      ::resize(&pVVar3[local_300].neighbors,(long)pVVar3[local_300].layer + 1);
      uVar6 = (ulong)local_300;
      pVVar3 = (pvVar5->
               super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2c0 = (long)pVVar3[uVar6].layer;
      this_00 = *(vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  **)&pVVar3[uVar6].neighbors.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl;
      local_2f8 = *(vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                    **)((long)&pVVar3[uVar6].neighbors.
                               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                               ._M_impl + 8);
      if (this_00 != local_2f8) {
        lVar8 = 0;
        do {
          std::istream::read(local_238,(long)&local_2fc);
          auVar11._8_56_ = extraout_var_00;
          auVar11._0_8_ = extraout_XMM1_Qa_00;
          auVar9 = auVar11._0_16_;
          std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)this_00,(ulong)local_2fc);
          if (local_2fc != 0) {
            uVar7 = 0;
            do {
              std::istream::read(local_238,(long)&local_2dc);
              auVar12._8_56_ = extraout_var_01;
              auVar12._0_8_ = extraout_XMM1_Qa_01;
              auVar9 = auVar12._0_16_;
              local_2e0 = 0.0;
              std::
              vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
              emplace_back<unsigned_int&,float>(this_00,&local_2dc,&local_2e0);
              if (*puVar1 <= local_2dc) {
                puts("Data corrupted");
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < local_2fc);
          }
          local_2d0 = local_2d0 + (ulong)local_2fc;
          local_2b8[lVar8] = local_2b8[lVar8] + 1;
          lVar8 = lVar8 + 1;
          this_00 = this_00 + 0x18;
        } while (this_00 != local_2f8);
      }
      iVar2 = (local_2f0->vertices_).
              super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>.
              _M_impl.super__Vector_impl_data._M_start[local_300].layer;
      if (local_2f0->top_layer_ < iVar2) {
        local_2f0->top_layer_ = iVar2;
        local_2f0->ep_ = local_300;
      }
      lVar8 = local_2c0 + 1 + local_2e8;
      uVar7 = (int)local_2d8 + 1;
      local_2d8 = (ulong)uVar7;
      local_2e8 = lVar8;
    } while (uVar7 < *puVar1);
    auVar9 = vcvtusi2sd_avx512f(auVar9,local_2d0);
    local_2f8 = auVar9._0_8_;
    this = local_2f0;
  }
  std::ifstream::close();
  auVar13._8_56_ = extraout_var_02;
  auVar13._0_8_ = extraout_XMM1_Qa_02;
  auVar9 = auVar13._0_16_;
  printf("Loaded %u points into index\n",(ulong)this->num_points_);
  auVar9 = vcvtusi2sd_avx512f(auVar9,this->num_points_);
  printf("Total layers: %lu, avg out degrees: %f\n",(double)local_2f8 / auVar9._0_8_,lVar8);
  if (-1 < this->top_layer_) {
    uVar6 = 0;
    do {
      printf("Layer %d: %d\n",uVar6 & 0xffffffff,(ulong)local_2b8[uVar6]);
      bVar4 = (long)uVar6 < (long)this->top_layer_;
      uVar6 = uVar6 + 1;
    } while (bVar4);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void LoadIndex(const char *filename) {
    printf("Loading index from %s\n", filename);

    std::ifstream is(filename, std::ios::binary | std::ios::in);
    is.read((char *)&num_points_, sizeof(index_t));
    vertices_.resize(num_points_);

    int layers[32];
    memset(layers, 0, sizeof(layers));
    size_t num_layers = 0, out_degrees = 0;

    ep_ = 0;
    top_layer_ = 0;
    for (uint32_t i = 0; i < num_points_; i++) {
      index_t idx;
      is.read((char *)&idx, sizeof(index_t));
      is.read((char *)&vertices_[idx].layer, sizeof(layer_t));
      vertices_[idx].neighbors.resize(vertices_[idx].layer + 1);

      num_layers += vertices_[idx].layer + 1;

      layer_t layer = 0;
      for (auto &neighbors : vertices_[idx].neighbors) {
        index_t num_neighbors;
        is.read((char *)&num_neighbors, sizeof(index_t));
        neighbors.reserve(num_neighbors);
        for (uint32_t j = 0; j < num_neighbors; j++) {
          index_t edge;
          is.read((char *)&edge, sizeof(index_t));
          neighbors.emplace_back(edge, 0.0f);
          if (edge >= num_points_) {
            printf("Data corrupted\n");
          }
        }
        // is.read((char *)neighbors.data(), sizeof(Point) * num_neighbors);
        out_degrees += num_neighbors;
        layers[layer++] += 1;
      }

      if (vertices_[idx].layer > top_layer_) {
        top_layer_ = vertices_[idx].layer;
        ep_ = idx;
      }
    }
    is.close();
    printf("Loaded %u points into index\n", num_points_);
    printf("Total layers: %lu, avg out degrees: %f\n", num_layers, 1.0 * out_degrees / num_points_);
    for (int i = 0; i <= top_layer_; i++) {
      printf("Layer %d: %d\n", i, layers[i]);
    }
  }